

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O0

void __thiscall xercesc_4_0::QName::QName(QName *this,QName *qname)

{
  int iVar1;
  uint uVar2;
  XMLCh *pXVar3;
  XMLSize_t XVar4;
  undefined4 extraout_var;
  XMLCh *pXVar5;
  undefined4 extraout_var_00;
  XMLSize_t newLen;
  QName *qname_local;
  QName *this_local;
  
  XSerializable::XSerializable(&this->super_XSerializable,&qname->super_XSerializable);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__QName_00524eb0;
  this->fPrefixBufSz = 0;
  this->fLocalPartBufSz = 0;
  this->fRawNameBufSz = 0;
  this->fURIId = 0;
  this->fPrefix = (XMLCh *)0x0;
  this->fLocalPart = (XMLCh *)0x0;
  this->fRawName = (XMLCh *)0x0;
  this->fMemoryManager = qname->fMemoryManager;
  pXVar3 = getLocalPart(qname);
  XVar4 = XMLString::stringLen(pXVar3);
  this->fLocalPartBufSz = XVar4 + 8;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,this->fLocalPartBufSz * 2 + 2);
  this->fLocalPart = (XMLCh *)CONCAT44(extraout_var,iVar1);
  pXVar3 = this->fLocalPart;
  pXVar5 = getLocalPart(qname);
  XMLString::moveChars(pXVar3,pXVar5,XVar4 + 1);
  pXVar3 = getPrefix(qname);
  XVar4 = XMLString::stringLen(pXVar3);
  this->fPrefixBufSz = XVar4 + 8;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,this->fPrefixBufSz * 2 + 2);
  this->fPrefix = (XMLCh *)CONCAT44(extraout_var_00,iVar1);
  pXVar3 = this->fPrefix;
  pXVar5 = getPrefix(qname);
  XMLString::moveChars(pXVar3,pXVar5,XVar4 + 1);
  uVar2 = getURI(qname);
  this->fURIId = uVar2;
  return;
}

Assistant:

QName::QName(const QName& qname)
:XSerializable(qname)
,XMemory(qname)
,fPrefixBufSz(0)
,fLocalPartBufSz(0)
,fRawNameBufSz(0)
,fURIId(0)
,fPrefix(0)
,fLocalPart(0)
,fRawName(0)
,fMemoryManager(qname.fMemoryManager)
{
    XMLSize_t newLen;

    newLen = XMLString::stringLen(qname.getLocalPart());
    fLocalPartBufSz = newLen + 8;
    fLocalPart = (XMLCh*) fMemoryManager->allocate
    (
        (fLocalPartBufSz + 1) * sizeof(XMLCh)
    ); //new XMLCh[fLocalPartBufSz + 1];
    XMLString::moveChars(fLocalPart, qname.getLocalPart(), newLen + 1);

    newLen = XMLString::stringLen(qname.getPrefix());
    fPrefixBufSz = newLen + 8;
    fPrefix = (XMLCh*) fMemoryManager->allocate
    (
        (fPrefixBufSz + 1) * sizeof(XMLCh)
    ); //new XMLCh[fPrefixBufSz + 1];
    XMLString::moveChars(fPrefix, qname.getPrefix(), newLen + 1);

    fURIId = qname.getURI();
}